

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O3

void __thiscall
Js::DynamicProfileInfo::SetHasNewPolyFieldAccess
          (DynamicProfileInfo *this,FunctionBody *functionBody)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  ScriptContext *pSVar3;
  undefined4 *puVar4;
  FunctionInfo *pFVar5;
  uint32 uVar6;
  
  pSVar3 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  uVar6 = pSVar3->threadContext->polymorphicCacheState + 1;
  pSVar3->threadContext->polymorphicCacheState = uVar6;
  this->polymorphicCacheState = uVar6;
  sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
  pFVar5 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar5 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    pFVar5 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  bVar2 = Phases::IsEnabled((Phases *)&DAT_015b6718,ObjTypeSpecPhase,sourceContextId,
                            pFVar5->functionId);
  if (bVar2) {
    Output::Print(L"New profile cache state: %d\n",(ulong)this->polymorphicCacheState);
    Output::Flush();
    return;
  }
  return;
}

Assistant:

void DynamicProfileInfo::SetHasNewPolyFieldAccess(FunctionBody *functionBody)
    {
        this->polymorphicCacheState = functionBody->GetScriptContext()->GetThreadContext()->GetNextPolymorphicCacheState();

        PHASE_PRINT_TRACE(
            Js::ObjTypeSpecPhase, functionBody,
            _u("New profile cache state: %d\n"), this->polymorphicCacheState);
    }